

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

FT_Error T1_Get_MM_Var(T1_Face face,FT_MM_Var **master)

{
  FT_Memory memory_00;
  PS_Blend pPVar1;
  int iVar2;
  ulong uVar3;
  FT_Fixed FVar4;
  FT_Offset axis_size;
  FT_Offset axis_flags_size;
  FT_Offset mmvar_size;
  FT_UShort *axis_flags;
  PS_Blend blend;
  FT_Fixed axiscoords [4];
  FT_UInt i;
  FT_Error error;
  FT_Multi_Master mmaster;
  FT_MM_Var *mmvar;
  FT_Memory memory;
  FT_MM_Var **master_local;
  T1_Face face_local;
  
  memory_00 = (face->root).memory;
  mmaster.axis[3].maximum = 0;
  pPVar1 = face->blend;
  axiscoords[3]._4_4_ = T1_Get_Multi_Master(face,(FT_Multi_Master *)&i);
  if (axiscoords[3]._4_4_ == 0) {
    uVar3 = (ulong)i * 2 + 7 & 0xfffffffffffffff8;
    mmaster.axis[3].maximum =
         (FT_Long)ft_mem_alloc(memory_00,uVar3 + 0x20 + (ulong)i * 0x30,
                               (FT_Error *)((long)axiscoords + 0x1c));
    if (axiscoords[3]._4_4_ == 0) {
      *(FT_UInt *)mmaster.axis[3].maximum = i;
      *(FT_Error *)(mmaster.axis[3].maximum + 4) = error;
      *(FT_UInt *)(mmaster.axis[3].maximum + 8) = 0;
      for (axiscoords[3]._0_4_ = 0; (uint)axiscoords[3] < i;
          axiscoords[3]._0_4_ = (uint)axiscoords[3] + 1) {
        *(undefined2 *)(mmaster.axis[3].maximum + (ulong)(uint)axiscoords[3] * 2 + 0x20) = 0;
      }
      *(ulong *)(mmaster.axis[3].maximum + 0x10) = mmaster.axis[3].maximum + uVar3 + 0x20;
      *(FT_UInt *)(mmaster.axis[3].maximum + 0x18) = 0;
      *(FT_UInt *)(mmaster.axis[3].maximum + 0x1c) = 0;
      for (axiscoords[3]._0_4_ = 0; (uint)axiscoords[3] < i;
          axiscoords[3]._0_4_ = (uint)axiscoords[3] + 1) {
        *(FT_Long *)(*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30)
             = mmaster.axis[(ulong)(uint)axiscoords[3] - 1].maximum;
        *(long *)(*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30 + 8)
             = (long)mmaster.axis[(uint)axiscoords[3]].name << 0x10;
        *(FT_Long *)
         (*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30 + 0x18) =
             mmaster.axis[(uint)axiscoords[3]].minimum << 0x10;
        *(undefined4 *)
         (*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30 + 0x28) =
             0xffffffff;
        *(undefined8 *)
         (*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30 + 0x20) =
             0xffffffff;
        if (*(long *)(*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30)
            != 0) {
          iVar2 = strcmp(*(char **)(*(long *)(mmaster.axis[3].maximum + 0x10) +
                                   (ulong)(uint)axiscoords[3] * 0x30),"Weight");
          if (iVar2 == 0) {
            *(undefined8 *)
             (*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30 + 0x20)
                 = 0x77676874;
          }
          else {
            iVar2 = strcmp(*(char **)(*(long *)(mmaster.axis[3].maximum + 0x10) +
                                     (ulong)(uint)axiscoords[3] * 0x30),"Width");
            if (iVar2 == 0) {
              *(undefined8 *)
               (*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30 + 0x20
               ) = 0x77647468;
            }
            else {
              iVar2 = strcmp(*(char **)(*(long *)(mmaster.axis[3].maximum + 0x10) +
                                       (ulong)(uint)axiscoords[3] * 0x30),"OpticalSize");
              if (iVar2 == 0) {
                *(undefined8 *)
                 (*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30 +
                 0x20) = 0x6f70737a;
              }
              else {
                iVar2 = strcmp(*(char **)(*(long *)(mmaster.axis[3].maximum + 0x10) +
                                         (ulong)(uint)axiscoords[3] * 0x30),"Slant");
                if (iVar2 == 0) {
                  *(undefined8 *)
                   (*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30 +
                   0x20) = 0x736c6e74;
                }
                else {
                  iVar2 = strcmp(*(char **)(*(long *)(mmaster.axis[3].maximum + 0x10) +
                                           (ulong)(uint)axiscoords[3] * 0x30),"Italic");
                  if (iVar2 == 0) {
                    *(undefined8 *)
                     (*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30
                     + 0x20) = 0x6974616c;
                  }
                }
              }
            }
          }
        }
      }
      mm_weights_unmap(pPVar1->default_weight_vector,(FT_Fixed *)&blend,pPVar1->num_axis);
      for (axiscoords[3]._0_4_ = 0; (uint)axiscoords[3] < i;
          axiscoords[3]._0_4_ = (uint)axiscoords[3] + 1) {
        FVar4 = mm_axis_unmap(pPVar1->design_map + (uint)axiscoords[3],
                              axiscoords[(ulong)(uint)axiscoords[3] - 1]);
        *(FT_Fixed *)
         (*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30 + 0x10) =
             FVar4;
      }
      *master = (FT_MM_Var *)mmaster.axis[3].maximum;
    }
  }
  return axiscoords[3]._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Get_MM_Var( T1_Face      face,
                 FT_MM_Var*  *master )
  {
    FT_Memory        memory = face->root.memory;
    FT_MM_Var       *mmvar = NULL;
    FT_Multi_Master  mmaster;
    FT_Error         error;
    FT_UInt          i;
    FT_Fixed         axiscoords[T1_MAX_MM_AXIS];
    PS_Blend         blend = face->blend;
    FT_UShort*       axis_flags;

    FT_Offset  mmvar_size;
    FT_Offset  axis_flags_size;
    FT_Offset  axis_size;


    error = T1_Get_Multi_Master( face, &mmaster );
    if ( error )
      goto Exit;

    /* the various `*_size' variables, which we also use as     */
    /* offsets into the `mmvar' array, must be multiples of the */
    /* pointer size (except the last one); without such an      */
    /* alignment there might be runtime errors due to           */
    /* misaligned addresses                                     */
#undef  ALIGN_SIZE
#define ALIGN_SIZE( n ) \
          ( ( (n) + sizeof (void*) - 1 ) & ~( sizeof (void*) - 1 ) )

    mmvar_size      = ALIGN_SIZE( sizeof ( FT_MM_Var ) );
    axis_flags_size = ALIGN_SIZE( mmaster.num_axis *
                                  sizeof ( FT_UShort ) );
    axis_size       = mmaster.num_axis * sizeof ( FT_Var_Axis );

    if ( FT_ALLOC( mmvar, mmvar_size +
                          axis_flags_size +
                          axis_size ) )
      goto Exit;

    mmvar->num_axis        = mmaster.num_axis;
    mmvar->num_designs     = mmaster.num_designs;
    mmvar->num_namedstyles = 0;                           /* Not supported */

    /* while axis flags are meaningless here, we have to provide the array */
    /* to make `FT_Get_Var_Axis_Flags' work: the function expects that the */
    /* values directly follow the data of `FT_MM_Var'                      */
    axis_flags = (FT_UShort*)( (char*)mmvar + mmvar_size );
    for ( i = 0; i < mmaster.num_axis; i++ )
      axis_flags[i] = 0;

    mmvar->axis       = (FT_Var_Axis*)( (char*)axis_flags + axis_flags_size );
    mmvar->namedstyle = NULL;

    for ( i = 0; i < mmaster.num_axis; i++ )
    {
      mmvar->axis[i].name    = mmaster.axis[i].name;
      mmvar->axis[i].minimum = INT_TO_FIXED( mmaster.axis[i].minimum );
      mmvar->axis[i].maximum = INT_TO_FIXED( mmaster.axis[i].maximum );
      mmvar->axis[i].strid   = ~0U;                      /* Does not apply */
      mmvar->axis[i].tag     = ~0U;                      /* Does not apply */

      if ( !mmvar->axis[i].name )
        continue;

      if ( ft_strcmp( mmvar->axis[i].name, "Weight" ) == 0 )
        mmvar->axis[i].tag = FT_MAKE_TAG( 'w', 'g', 'h', 't' );
      else if ( ft_strcmp( mmvar->axis[i].name, "Width" ) == 0 )
        mmvar->axis[i].tag = FT_MAKE_TAG( 'w', 'd', 't', 'h' );
      else if ( ft_strcmp( mmvar->axis[i].name, "OpticalSize" ) == 0 )
        mmvar->axis[i].tag = FT_MAKE_TAG( 'o', 'p', 's', 'z' );
      else if ( ft_strcmp( mmvar->axis[i].name, "Slant" ) == 0 )
        mmvar->axis[i].tag = FT_MAKE_TAG( 's', 'l', 'n', 't' );
      else if ( ft_strcmp( mmvar->axis[i].name, "Italic" ) == 0 )
        mmvar->axis[i].tag = FT_MAKE_TAG( 'i', 't', 'a', 'l' );
    }

    mm_weights_unmap( blend->default_weight_vector,
                      axiscoords,
                      blend->num_axis );

    for ( i = 0; i < mmaster.num_axis; i++ )
      mmvar->axis[i].def = mm_axis_unmap( &blend->design_map[i],
                                          axiscoords[i] );

    *master = mmvar;

  Exit:
    return error;
  }